

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O3

void Au_NtkTerSimulate_rec(Au_Ntk_t *p)

{
  void *pvVar1;
  Au_Ntk_t *p_00;
  int iVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  ulong *puVar11;
  long lVar12;
  long lVar13;
  ulong *puVar14;
  
  iVar2 = (p->vPis).nSize;
  if (0 < iVar2) {
    if (iVar2 != 0) {
      uVar6 = *(p->vPis).pArray;
      (*(code *)(&DAT_00a6ab54 +
                *(int *)(&DAT_00a6ab54 +
                        (ulong)(*(uint *)((long)(p->vPages).pArray[(int)uVar6 >> 0xc] +
                                         (ulong)((uVar6 & 0xfff) << 4)) >> 0x1e) * 4)))
                (0x3ff0000000000000);
      return;
    }
LAB_0086f4e1:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar2 = strcmp(p->pName,"ref_egcd");
  if (iVar2 == 0) {
    printf("Replacing one instance of recursive model \"%s\" by a black box.\n","ref_egcd");
    uVar6 = (p->vPos).nSize;
    uVar4 = (ulong)uVar6;
    if (0 < (int)uVar6) {
      lVar12 = 0;
      do {
        if ((int)uVar4 <= lVar12) goto LAB_0086f4e1;
        uVar6 = (p->vPos).pArray[lVar12];
        puVar14 = (ulong *)((long)(p->vPages).pArray[(int)uVar6 >> 0xc] +
                           (ulong)((uVar6 & 0xfff) << 4));
        *puVar14 = *puVar14 | 0xc0000000;
        lVar12 = lVar12 + 1;
        uVar4 = (ulong)(p->vPos).nSize;
      } while (lVar12 < (long)uVar4);
    }
    return;
  }
  uVar6 = (p->vObjs).nSize;
  uVar4 = (ulong)uVar6;
  if ((int)uVar6 < 1) {
    puVar14 = (ulong *)0x0;
LAB_0086f37a:
    uVar6 = (p->vPos).nSize;
    uVar4 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      return;
    }
    lVar12 = 0;
    do {
      if ((int)uVar4 <= lVar12) goto LAB_0086f4e1;
      if ((*puVar14 < 0x800000000) || (uVar6 = (uint)puVar14[1], uVar6 == 0)) {
LAB_0086f51f:
        __assert_fail("i >= 0 && i < (int)p->nFanins && p->Fanins[i]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieNew.c"
                      ,0xa5,"int Au_ObjFaninId(Au_Obj_t *, int)");
      }
      uVar5 = (p->vPos).pArray[lVar12];
      puVar11 = (ulong *)((ulong)((uVar5 & 0xfff) << 4) +
                         (long)(p->vPages).pArray[(int)uVar5 >> 0xc]);
      uVar5 = *(uint *)(*(long *)(*(long *)(*(long *)((long)puVar14 - (ulong)((uint)puVar14 & 0x3ff)
                                                     ) + 0x78) + (long)((int)uVar6 >> 0xd) * 8) +
                       (ulong)(uVar6 & 0x1ffe) * 8) >> 0x1e;
      if ((uVar6 & 1) != 0) {
        (*(code *)(&DAT_00a6abd4 + *(int *)(&DAT_00a6abd4 + (ulong)uVar5 * 4)))
                  (&DAT_00a6abd4 + *(int *)(&DAT_00a6abd4 + (ulong)uVar5 * 4));
        return;
      }
      *puVar11 = *puVar11 & 0xffffffff3fffffff | (ulong)(uVar5 << 0x1e);
      lVar12 = lVar12 + 1;
      iVar2 = (p->vPos).nSize;
      uVar4 = (ulong)iVar2;
    } while (lVar12 < (long)uVar4);
    if (iVar2 < 1) {
      return;
    }
    if (uVar4 != 0) {
      uVar6 = *(p->vPos).pArray;
      (*(code *)(&DAT_00a6abe4 +
                *(int *)(&DAT_00a6abe4 +
                        (ulong)(*(uint *)((long)(p->vPages).pArray[(int)uVar6 >> 0xc] +
                                         (ulong)((uVar6 & 0xfff) << 4)) >> 0x1e) * 4)))
                (0x3ff0000000000000);
      return;
    }
    goto LAB_0086f4e1;
  }
  lVar12 = 0;
LAB_0086ecfb:
  if ((int)uVar4 <= lVar12) goto LAB_0086f4e1;
  uVar6 = (p->vObjs).pArray[lVar12];
  pvVar1 = (p->vPages).pArray[(int)uVar6 >> 0xc];
  uVar4 = (ulong)((uVar6 & 0xfff) << 4);
  puVar14 = (ulong *)((long)pvVar1 + uVar4);
  uVar4 = *(ulong *)((long)pvVar1 + uVar4);
  uVar7 = uVar4 & 0x700000000;
  if (uVar7 == 0x100000000) {
    uVar7 = uVar4 & 0xfffffff93fffffff | 0x40000000;
  }
  else {
    uVar5 = (uint)uVar4;
    uVar6 = (uint)(uVar4 >> 0x20);
    if (uVar7 == 0x600000000) {
      lVar13 = *(long *)(*(long *)((ulong)puVar14 & 0xfffffffffffffc00) + 8);
      if (*(int *)(lVar13 + 0xc) <= (int)(uVar5 & 0x3fffffff)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      p_00 = *(Au_Ntk_t **)(*(long *)(lVar13 + 0x10) + (ulong)(uVar5 & 0x3fffffff) * 8);
      if (p_00->nObjs[2] != uVar6 >> 3) {
        __assert_fail("Au_ObjFaninNum(pObj) == Au_NtkPiNum(pModel)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieNew.c"
                      ,0x552,"void Au_NtkTerSimulate_rec(Au_Ntk_t *)");
      }
      if (*(int *)((long)puVar14 + (uVar4 >> 0x23) * 4 + 8) != p_00->nObjs[3]) {
        __assert_fail("Au_BoxFanoutNum(pObj) == Au_NtkPoNum(pModel)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieNew.c"
                      ,0x553,"void Au_NtkTerSimulate_rec(Au_Ntk_t *)");
      }
      lVar13 = -(ulong)((uint)puVar14 & 0x3ff);
      if (0x7ffffffff < uVar4) {
        uVar4 = 0;
        do {
          uVar6 = *(uint *)((long)puVar14 + uVar4 * 4 + 8);
          if (uVar6 == 0) goto LAB_0086f51f;
          if ((long)(p_00->vPis).nSize <= (long)uVar4) goto LAB_0086f4e1;
          uVar5 = (p_00->vPis).pArray[uVar4];
          pvVar1 = (p_00->vPages).pArray[(int)uVar5 >> 0xc];
          uVar7 = (ulong)((uVar5 & 0xfff) << 4);
          *(ulong *)((long)pvVar1 + uVar7) =
               *(ulong *)((long)pvVar1 + uVar7) & 0xffffffff3fffffff |
               (ulong)((uint)*(undefined8 *)
                              (*(long *)(*(long *)(*(long *)((long)puVar14 + lVar13) + 0x78) +
                                        (long)((int)uVar6 >> 0xd) * 8) + (ulong)(uVar6 & 0x1ffe) * 8
                              ) & 0xc0000000);
          uVar4 = uVar4 + 1;
        } while (uVar4 < *puVar14 >> 0x23);
      }
      Au_NtkTerSimulate_rec(p_00);
      uVar4 = *puVar14;
      if ((uVar4 & 0x700000000) != 0x600000000) {
LAB_0086f500:
        __assert_fail("Au_ObjIsBox(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieNew.c"
                      ,0xb5,"int Au_BoxFanoutNum(Au_Obj_t *)");
      }
      lVar8 = 0;
      while (lVar8 < *(int *)((long)puVar14 + (uVar4 >> 0x23) * 4 + 8)) {
        if ((p_00->vPos).nSize <= lVar8) goto LAB_0086f4e1;
        lVar3 = (uVar4 >> 0x23) + lVar8;
        uVar6 = (p_00->vPos).pArray[lVar8];
        lVar8 = lVar8 + 1;
        uVar5 = *(uint *)((long)puVar14 + lVar3 * 4 + 0xc);
        lVar3 = *(long *)(*(long *)(*(long *)((long)puVar14 + lVar13) + 0x78) +
                         (long)((int)uVar5 >> 0xc) * 8);
        uVar4 = (ulong)((uVar5 & 0xfff) << 4);
        *(ulong *)(lVar3 + uVar4) =
             *(ulong *)(lVar3 + uVar4) & 0xffffffff3fffffff |
             (ulong)((uint)*(undefined8 *)
                            ((long)(p_00->vPages).pArray[(int)uVar6 >> 0xc] +
                            (ulong)((uVar6 & 0xfff) << 4)) & 0xc0000000);
        uVar4 = *puVar14;
        if ((uVar4 & 0x700000000) != 0x600000000) goto LAB_0086f500;
      }
      goto LAB_0086f2fd;
    }
    if (uVar7 != 0x700000000) goto LAB_0086f2fd;
    uVar5 = uVar5 & 0x3fffffff;
    if (uVar5 != 3) {
      if (uVar5 == 2) {
        if ((uVar4 < 0x800000000) || (uVar6 = (uint)puVar14[1], uVar6 == 0)) goto LAB_0086f51f;
        lVar13 = *(long *)(*(long *)((ulong)puVar14 & 0xfffffffffffffc00) + 0x78);
        uVar5 = *(uint *)(*(long *)(lVar13 + (long)((int)uVar6 >> 0xd) * 8) +
                         (ulong)(uVar6 & 0x1ffe) * 8) >> 0x1e;
        if ((uVar6 & 1) != 0) {
          (*(code *)(&DAT_00a6ab94 + *(int *)(&DAT_00a6ab94 + (ulong)uVar5 * 4)))
                    (&DAT_00a6ab94,&DAT_00a6ab94 + *(int *)(&DAT_00a6ab94 + (ulong)uVar5 * 4));
          return;
        }
        if ((uVar4 < 0x1000000000) || (uVar6 = *(uint *)((long)puVar14 + 0xc), uVar6 == 0))
        goto LAB_0086f51f;
        uVar9 = *(uint *)(*(long *)(lVar13 + (long)((int)uVar6 >> 0xd) * 8) +
                         (ulong)(uVar6 & 0x1ffe) * 8) >> 0x1e;
        if ((uVar6 & 1) != 0) {
          (*(code *)(&DAT_00a6aba4 + *(int *)(&DAT_00a6aba4 + (ulong)uVar9 * 4)))
                    (&DAT_00a6aba4,&DAT_00a6aba4 + *(int *)(&DAT_00a6aba4 + (ulong)uVar9 * 4));
          return;
        }
        uVar7 = 0x80000000;
        if ((uVar9 != 1) != (uVar5 == 1)) {
          uVar7 = 0x40000000;
        }
        if (uVar9 == 3) {
          uVar7 = 0xc0000000;
        }
        if (uVar5 == 3) {
          uVar7 = 0xc0000000;
        }
      }
      else {
        if (uVar5 != 1) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieNew.c"
                        ,0x54c,"void Au_NtkTerSimulate_rec(Au_Ntk_t *)");
        }
        if ((uVar4 < 0x800000000) || (uVar6 = (uint)puVar14[1], uVar6 == 0)) goto LAB_0086f51f;
        lVar13 = *(long *)(*(long *)((ulong)puVar14 & 0xfffffffffffffc00) + 0x78);
        uVar5 = *(uint *)(*(long *)(lVar13 + (long)((int)uVar6 >> 0xd) * 8) +
                         (ulong)(uVar6 & 0x1ffe) * 8) >> 0x1e;
        if ((uVar6 & 1) != 0) {
          (*(code *)(&DAT_00a6abb4 + *(int *)(&DAT_00a6abb4 + (ulong)uVar5 * 4)))
                    (&DAT_00a6abb4,&DAT_00a6abb4 + *(int *)(&DAT_00a6abb4 + (ulong)uVar5 * 4));
          return;
        }
        if ((uVar4 < 0x1000000000) || (uVar6 = *(uint *)((long)puVar14 + 0xc), uVar6 == 0))
        goto LAB_0086f51f;
        uVar9 = *(uint *)(*(long *)(lVar13 + (long)((int)uVar6 >> 0xd) * 8) +
                         (ulong)(uVar6 & 0x1ffe) * 8) >> 0x1e;
        if ((uVar6 & 1) != 0) {
          (*(code *)(&DAT_00a6abc4 + *(int *)(&DAT_00a6abc4 + (ulong)uVar9 * 4)))
                    (&DAT_00a6abc4,&DAT_00a6abc4 + *(int *)(&DAT_00a6abc4 + (ulong)uVar9 * 4));
          return;
        }
        uVar7 = 0x40000000;
        if ((((uVar5 != 1) && (uVar9 != 1)) && (uVar7 = 0xc0000000, uVar5 != 3)) && (uVar9 != 3)) {
          if ((uVar5 != 2) || (uVar9 != 2)) {
            __assert_fail("Value0 == AU_VAL1 && Value1 == AU_VAL1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieNew.c"
                          ,0x4fb,"int Au_XsimAnd(int, int)");
          }
          uVar7 = 0x80000000;
        }
      }
      uVar7 = uVar4 & 0xffffffff3fffffff | uVar7;
      goto LAB_0086f2fa;
    }
    if ((uVar4 < 0x800000000) || (uVar5 = (uint)puVar14[1], uVar5 == 0)) goto LAB_0086f51f;
    lVar13 = *(long *)(*(long *)((ulong)puVar14 & 0xfffffffffffffc00) + 0x78);
    uVar9 = *(uint *)(*(long *)(lVar13 + (long)((int)uVar5 >> 0xd) * 8) +
                     (ulong)(uVar5 & 0x1ffe) * 8) >> 0x1e;
    if ((uVar5 & 1) != 0) {
      (*(code *)(&DAT_00a6ab64 + *(int *)(&DAT_00a6ab64 + (ulong)uVar9 * 4)))
                (&DAT_00a6ab64,&DAT_00a6ab64 + *(int *)(&DAT_00a6ab64 + (ulong)uVar9 * 4));
      return;
    }
    if ((uVar4 < 0x1000000000) || (uVar5 = *(uint *)((long)puVar14 + 0xc), uVar5 == 0))
    goto LAB_0086f51f;
    uVar10 = *(uint *)(*(long *)(lVar13 + (long)((int)uVar5 >> 0xd) * 8) +
                      (ulong)(uVar5 & 0x1ffe) * 8) >> 0x1e;
    if ((uVar5 & 1) != 0) {
      (*(code *)(&DAT_00a6ab74 + *(int *)(&DAT_00a6ab74 + (ulong)uVar10 * 4)))
                (&DAT_00a6ab74 + *(int *)(&DAT_00a6ab74 + (ulong)uVar10 * 4));
      return;
    }
    if ((uVar6 >> 3 < 3) || (uVar6 = (uint)puVar14[2], uVar6 == 0)) goto LAB_0086f51f;
    uVar5 = *(uint *)(*(long *)(lVar13 + (long)((int)uVar6 >> 0xd) * 8) +
                     (ulong)(uVar6 & 0x1ffe) * 8) >> 0x1e;
    if ((uVar6 & 1) != 0) {
      (*(code *)(&DAT_00a6ab84 + *(int *)(&DAT_00a6ab84 + (ulong)uVar5 * 4)))
                (&DAT_00a6ab84 + *(int *)(&DAT_00a6ab84 + (ulong)uVar5 * 4));
      return;
    }
    uVar6 = uVar5;
    if (((uVar9 != 1) && (uVar6 = uVar10, uVar9 != 2)) && ((uVar10 != 1 || (uVar6 = 1, uVar5 != 1)))
       ) {
      uVar6 = (uVar10 == 2 && uVar5 == 2) ^ 3;
    }
    uVar7 = uVar4 & 0xffffffff3fffffff | (ulong)(uVar6 << 0x1e);
  }
LAB_0086f2fa:
  *puVar14 = uVar7;
LAB_0086f2fd:
  lVar12 = lVar12 + 1;
  uVar4 = (ulong)(p->vObjs).nSize;
  if ((long)uVar4 <= lVar12) goto LAB_0086f37a;
  goto LAB_0086ecfb;
}

Assistant:

void Au_NtkTerSimulate_rec( Au_Ntk_t * p )
{ 
    Au_Obj_t * pObj = NULL, * pTerm;
    int i, k;
    Au_NtkForEachPi( p, pTerm, i )
    {
        assert( Au_ObjGetXsim(pTerm) > 0 );
        if ( Au_ObjGetXsim(pTerm) == AU_VALX )
            p->pMan->nPortsNC++;
        else if ( Au_ObjGetXsim(pTerm) == AU_VAL0 )
            p->pMan->nPortsC0++;
        else
            p->pMan->nPortsC1++;
    }
    if ( strcmp(Au_NtkName(p), "ref_egcd") == 0 )
    {
        printf( "Replacing one instance of recursive model \"%s\" by a black box.\n", "ref_egcd" );
        Au_NtkForEachPo( p, pTerm, i )
            Au_ObjSetXsim( pTerm, AU_VALX );
        return;
    }
    Au_NtkForEachObj( p, pObj, i )
    {
        if ( Au_ObjIsNode(pObj) )
        {
            if ( pObj->Func == 1 )
                Au_ObjSetXsim( pObj, Au_XsimAnd(Au_ObjGetXsimFan0(pObj), Au_ObjGetXsimFan1(pObj)) );
            else if ( pObj->Func == 2 )
                Au_ObjSetXsim( pObj, Au_XsimXor(Au_ObjGetXsimFan0(pObj), Au_ObjGetXsimFan1(pObj)) );
            else if ( pObj->Func == 3 )
                Au_ObjSetXsim( pObj, Au_XsimMux(Au_ObjGetXsimFan0(pObj), Au_ObjGetXsimFan1(pObj), Au_ObjGetXsimFan2(pObj)) );
            else assert( 0 );
        }
        else if ( Au_ObjIsBox(pObj) )
        {
            Au_Ntk_t * pModel = Au_ObjModel(pObj);
            // check the match between the number of actual and formal parameters
            assert( Au_ObjFaninNum(pObj) == Au_NtkPiNum(pModel) );
            assert( Au_BoxFanoutNum(pObj) == Au_NtkPoNum(pModel) );
            // assign PIs
            Au_ObjForEachFanin( pObj, pTerm, k )
                Au_ObjSetXsim( Au_NtkPi(pModel, k), Au_ObjGetXsim(pTerm) );
            // call recursively
            Au_NtkTerSimulate_rec( pModel );
            // assign POs
            Au_BoxForEachFanout( pObj, pTerm, k )
                Au_ObjSetXsim( pTerm, Au_ObjGetXsim(Au_NtkPo(pModel, k)) );
        }
        else if ( Au_ObjIsConst0(pObj) )
            Au_ObjSetXsim( pObj, AU_VAL0 );
            
    }
    Au_NtkForEachPo( p, pTerm, i )
        Au_ObjSetXsim( pTerm, Au_ObjGetXsimFan0(pObj) );
    Au_NtkForEachPo( p, pTerm, i )
    {
        assert( Au_ObjGetXsim(pTerm) > 0 );
        if ( Au_ObjGetXsim(pTerm) == AU_VALX )
            p->pMan->nPortsNC++;
        else if ( Au_ObjGetXsim(pTerm) == AU_VAL0 )
            p->pMan->nPortsC0++;
        else
            p->pMan->nPortsC1++;
    }
}